

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void boost::unordered::detail::foa::rw_spinlock::yield(uint k)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int oldst;
  int local_1c;
  timespec local_18;
  
  uVar3 = k & 0x3ff;
  if (uVar3 < 5) {
    uVar2 = 1;
    do {
      uVar1 = uVar2 >> ((byte)uVar3 & 0x1f);
      uVar2 = uVar2 + 1;
    } while (uVar1 == 0);
  }
  else {
    if (uVar3 != 0x3ff) {
      sched_yield();
      return;
    }
    pthread_setcancelstate(1,&local_1c);
    local_18.tv_sec = 0;
    local_18.tv_nsec = 1000;
    nanosleep(&local_18,(timespec *)0x0);
    pthread_setcancelstate(local_1c,&local_1c);
  }
  return;
}

Assistant:

static void yield(unsigned k) noexcept {
        unsigned const sleep_every = 1024; // see below

        k %= sleep_every;

        if (k < 5) {
            // Intel recommendation from the Optimization Reference Manual
            // Exponentially increase number of PAUSE instructions each
            // iteration until reaching a maximum which is approximately
            // one timeslice long (2^4 == 16 in our case)

            unsigned const pause_count = 1u << k;

            for (unsigned i = 0; i < pause_count; ++i) {
                boost::core::sp_thread_pause();
            }
        }
        else if (k < sleep_every - 1) {
            // Once the maximum number of PAUSE instructions is reached,
            // we switch to yielding the timeslice immediately

            boost::core::sp_thread_yield();
        }
        else {
            // After `sleep_every` iterations of no progress, we sleep,
            // to avoid a deadlock if a lower priority thread has the lock

            boost::core::sp_thread_sleep();
        }
    }